

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::CopyPublicDependenciesAliases
          (Generator *this,string *copy_from,FileDescriptor *file)

{
  int iVar1;
  FileDescriptor *pFVar2;
  string *psVar3;
  undefined1 local_68 [8];
  string module_alias;
  string module_name;
  int i;
  FileDescriptor *file_local;
  string *copy_from_local;
  Generator *this_local;
  
  module_name.field_2._12_4_ = 0;
  while( true ) {
    iVar1 = FileDescriptor::public_dependency_count(file);
    if (iVar1 <= (int)module_name.field_2._12_4_) break;
    pFVar2 = FileDescriptor::public_dependency(file,module_name.field_2._12_4_);
    psVar3 = FileDescriptor::name_abi_cxx11_(pFVar2);
    anon_unknown_0::ModuleName((string *)((long)&module_alias.field_2 + 8),psVar3);
    pFVar2 = FileDescriptor::public_dependency(file,module_name.field_2._12_4_);
    psVar3 = FileDescriptor::name_abi_cxx11_(pFVar2);
    anon_unknown_0::ModuleAlias((string *)local_68,psVar3);
    io::Printer::Print(this->printer_,
                       "try:\n  $alias$ = $copy_from$.$alias$\nexcept AttributeError:\n  $alias$ = $copy_from$.$module$\n"
                       ,"alias",(string *)local_68,"module",
                       (string *)((long)&module_alias.field_2 + 8),"copy_from",copy_from);
    pFVar2 = FileDescriptor::public_dependency(file,module_name.field_2._12_4_);
    CopyPublicDependenciesAliases(this,copy_from,pFVar2);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(module_alias.field_2._M_local_buf + 8));
    module_name.field_2._12_4_ = module_name.field_2._12_4_ + 1;
  }
  return;
}

Assistant:

void Generator::CopyPublicDependenciesAliases(
    const string& copy_from, const FileDescriptor* file) const {
  for (int i = 0; i < file->public_dependency_count(); ++i) {
    string module_name = ModuleName(file->public_dependency(i)->name());
    string module_alias = ModuleAlias(file->public_dependency(i)->name());
    // There's no module alias in the dependent file if it was generated by
    // an old protoc (less than 3.0.0-alpha-1). Use module name in this
    // situation.
    printer_->Print("try:\n"
                    "  $alias$ = $copy_from$.$alias$\n"
                    "except AttributeError:\n"
                    "  $alias$ = $copy_from$.$module$\n",
                    "alias", module_alias,
                    "module", module_name,
                    "copy_from", copy_from);
    CopyPublicDependenciesAliases(copy_from, file->public_dependency(i));
  }
}